

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

bool xercesc_4_0::XMLUri::processScheme(XMLCh *schemeStr,XMLSize_t *index)

{
  XMLCh *pXVar1;
  XMLCh *tmpPtr;
  XMLSize_t *index_local;
  XMLCh *schemeStr_local;
  
  pXVar1 = XMLString::findAny(schemeStr,(XMLCh *)SCHEME_SEPARATORS);
  if (pXVar1 == (XMLCh *)0x0) {
    schemeStr_local._7_1_ = false;
  }
  else {
    *index = (long)pXVar1 - (long)schemeStr >> 1;
    schemeStr_local._7_1_ = isConformantSchemeName(schemeStr,*index);
  }
  return schemeStr_local._7_1_;
}

Assistant:

bool XMLUri::processScheme(const XMLCh* const schemeStr, XMLSize_t& index)
{
    const XMLCh* tmpPtr = XMLString::findAny(schemeStr, SCHEME_SEPARATORS);

    if (tmpPtr) {
        index = tmpPtr - schemeStr;
        return isConformantSchemeName(schemeStr, index);
    }
    else {
        return false;
    }
}